

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graphics.cpp
# Opt level: O2

void __thiscall RenderTarget::clear(RenderTarget *this)

{
  pointer ppRVar1;
  Renderable *pRVar2;
  uint uVar3;
  
  uVar3 = 0;
  while( true ) {
    ppRVar1 = (this->objects).
              super__Vector_base<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->objects).
                      super__Vector_base<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)ppRVar1 >> 3) <=
        (ulong)uVar3) break;
    pRVar2 = ppRVar1[uVar3];
    if (pRVar2 != (Renderable *)0x0) {
      (*pRVar2->_vptr_Renderable[1])();
    }
    uVar3 = uVar3 + 1;
  }
  std::vector<nite::Program,_std::allocator<nite::Program>_>::clear(&this->programs);
  ppRVar1 = (this->objects).
            super__Vector_base<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->objects).super__Vector_base<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppRVar1) {
    (this->objects).super__Vector_base<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppRVar1;
  }
  return;
}

Assistant:

void clear(){
		for(unsigned i=0; i<objects.size(); i++){
			//objects[i]->~Renderable();
			delete objects[i];
		}
		programs.clear();
		objects.clear();
	}